

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O3

bool ApprovalTests::CommandReporter::exists(string *command)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  long *__command;
  string which;
  long local_48;
  long lStack_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = SystemUtils::isWindowsOs();
  if (!bVar1) {
    ::std::operator+(&local_38,"which ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)command);
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_38);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_48 = *plVar4;
      lStack_40 = plVar3[3];
      __command = &local_48;
    }
    else {
      local_48 = *plVar4;
      __command = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    iVar2 = system((char *)__command);
    if (__command != &local_48) {
      operator_delete(__command);
    }
    if (iVar2 == 0) {
      return true;
    }
  }
  bVar1 = FileUtils::fileExists(command);
  return bVar1;
}

Assistant:

bool CommandReporter::exists(const std::string& command)
    {
        bool foundByWhich = false;
        if (!SystemUtils::isWindowsOs())
        {
            std::string which = "which " + command + " > /dev/null 2>&1";
            int result = system(which.c_str());
            foundByWhich = (result == 0);
        }
        return foundByWhich || FileUtils::fileExists(command);
    }